

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O1

void __thiscall gl4cts::CopyImage::SmokeTest::SmokeTest(SmokeTest *this,Context *context)

{
  pointer *pptVar1;
  GLenum internal_format;
  iterator iVar2;
  GLenum GVar3;
  uint uVar4;
  long lVar5;
  testCase test_case;
  testCase local_40;
  
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"smoke_test","Test tries all formats and targets");
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SmokeTest_02114518;
  this->m_dst_buf_name = 0;
  this->m_dst_tex_name = 0;
  this->m_rb_name = 0;
  this->m_src_buf_name = 0;
  this->m_src_tex_name = 0;
  this->m_test_case_index = 0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::SmokeTest::testCase,_std::allocator<gl4cts::CopyImage::SmokeTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::SmokeTest::testCase,_std::allocator<gl4cts::CopyImage::SmokeTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::SmokeTest::testCase,_std::allocator<gl4cts::CopyImage::SmokeTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar4 = 0xfffffffb;
  lVar5 = 0;
  do {
    if (1 < uVar4) {
      local_40.m_target = *(GLenum *)((long)&s_valid_targets + lVar5);
      local_40.m_internal_format = 0x8d70;
      local_40.m_format = 0x8d99;
      local_40.m_type = 0x1405;
      iVar2._M_current =
           (this->m_test_cases).
           super__Vector_base<gl4cts::CopyImage::SmokeTest::testCase,_std::allocator<gl4cts::CopyImage::SmokeTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->m_test_cases).
          super__Vector_base<gl4cts::CopyImage::SmokeTest::testCase,_std::allocator<gl4cts::CopyImage::SmokeTest::testCase>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<gl4cts::CopyImage::SmokeTest::testCase,std::allocator<gl4cts::CopyImage::SmokeTest::testCase>>
        ::_M_realloc_insert<gl4cts::CopyImage::SmokeTest::testCase_const&>
                  ((vector<gl4cts::CopyImage::SmokeTest::testCase,std::allocator<gl4cts::CopyImage::SmokeTest::testCase>>
                    *)&this->m_test_cases,iVar2,&local_40);
      }
      else {
        (iVar2._M_current)->m_target = local_40.m_target;
        (iVar2._M_current)->m_internal_format = 0x8d70;
        (iVar2._M_current)->m_format = 0x8d99;
        (iVar2._M_current)->m_type = 0x1405;
        pptVar1 = &(this->m_test_cases).
                   super__Vector_base<gl4cts::CopyImage::SmokeTest::testCase,_std::allocator<gl4cts::CopyImage::SmokeTest::testCase>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pptVar1 = *pptVar1 + 1;
      }
    }
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x2c);
  lVar5 = 0;
  do {
    internal_format = *(GLenum *)((long)&s_internal_formats + lVar5);
    GVar3 = Utils::getFormat(internal_format);
    local_40.m_type = Utils::getType(internal_format);
    local_40.m_target = 0xde1;
    iVar2._M_current =
         (this->m_test_cases).
         super__Vector_base<gl4cts::CopyImage::SmokeTest::testCase,_std::allocator<gl4cts::CopyImage::SmokeTest::testCase>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_40.m_internal_format = internal_format;
    local_40.m_format = GVar3;
    if (iVar2._M_current ==
        (this->m_test_cases).
        super__Vector_base<gl4cts::CopyImage::SmokeTest::testCase,_std::allocator<gl4cts::CopyImage::SmokeTest::testCase>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<gl4cts::CopyImage::SmokeTest::testCase,std::allocator<gl4cts::CopyImage::SmokeTest::testCase>>
      ::_M_realloc_insert<gl4cts::CopyImage::SmokeTest::testCase_const&>
                ((vector<gl4cts::CopyImage::SmokeTest::testCase,std::allocator<gl4cts::CopyImage::SmokeTest::testCase>>
                  *)&this->m_test_cases,iVar2,&local_40);
    }
    else {
      (iVar2._M_current)->m_target = 0xde1;
      (iVar2._M_current)->m_internal_format = internal_format;
      (iVar2._M_current)->m_format = GVar3;
      (iVar2._M_current)->m_type = local_40.m_type;
      pptVar1 = &(this->m_test_cases).
                 super__Vector_base<gl4cts::CopyImage::SmokeTest::testCase,_std::allocator<gl4cts::CopyImage::SmokeTest::testCase>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pptVar1 = *pptVar1 + 1;
    }
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0xf4);
  return;
}

Assistant:

SmokeTest::SmokeTest(deqp::Context& context)
	: TestCase(context, "smoke_test", "Test tries all formats and targets")
	, m_dst_buf_name(0)
	, m_dst_tex_name(0)
	, m_rb_name(0)
	, m_src_buf_name(0)
	, m_src_tex_name(0)
	, m_test_case_index(0)
{
	/* Iterate over valid targets */
	for (GLuint tgt_id = 0; tgt_id < s_n_valid_targets; ++tgt_id)
	{
		const GLenum target = s_valid_targets[tgt_id];

		if (true == Utils::isTargetMultisampled(target))
		{
			continue;
		}

		const testCase test_case = { target, GL_RGBA32UI, GL_RGBA_INTEGER, GL_UNSIGNED_INT };

		m_test_cases.push_back(test_case);
	}

	/* Iterate over internal formats */
	for (GLuint fmt_id = 0; fmt_id < s_n_internal_formats; ++fmt_id)
	{
		const GLenum internal_format = s_internal_formats[fmt_id];
		const GLenum format			 = Utils::getFormat(internal_format);
		const GLenum type			 = Utils::getType(internal_format);

		const testCase test_case = { GL_TEXTURE_2D, internal_format, format, type };

		m_test_cases.push_back(test_case);
	}
}